

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted-payload.c
# Opt level: O0

int ndn_parse_encrypted_payload
              (uint8_t *input,uint32_t input_size,uint8_t *output,uint32_t *output_size,
              uint32_t aes_key_id)

{
  ndn_aes_key_t *aes_key;
  bool local_79;
  ndn_aes_key_t *key;
  undefined1 auStack_68 [4];
  uint32_t keyid;
  ndn_decoder_t decoder;
  uint8_t *encrypted_payload;
  uint8_t *iv;
  uint32_t local_40;
  uint32_t encrypted_payload_length;
  uint32_t length;
  uint32_t type;
  int ret_val;
  uint32_t aes_key_id_local;
  uint32_t *output_size_local;
  uint8_t *output_local;
  uint8_t *puStack_18;
  uint32_t input_size_local;
  uint8_t *input_local;
  
  length = 0xffffffff;
  encrypted_payload_length = 0;
  local_40 = 0;
  iv._4_4_ = 0;
  encrypted_payload = (uint8_t *)0x0;
  decoder.input_size = 0;
  decoder.offset = 0;
  type = aes_key_id;
  _ret_val = output_size;
  output_size_local = (uint32_t *)output;
  output_local._4_4_ = input_size;
  puStack_18 = input;
  decoder_init((ndn_decoder_t *)auStack_68,input,input_size);
  do {
    length = decoder_get_type((ndn_decoder_t *)auStack_68,&encrypted_payload_length);
    if (length != 0) {
      return length;
    }
    length = decoder_get_length((ndn_decoder_t *)auStack_68,&local_40);
    if (length != 0) {
      return length;
    }
    if (encrypted_payload_length == 0x87) {
      if (local_40 != 0x10) {
        return -0xd;
      }
      encrypted_payload = _auStack_68 + decoder.input_value._4_4_;
      decoder_move_forward((ndn_decoder_t *)auStack_68,0x10);
    }
    else if (encrypted_payload_length == 0x81) {
      key._4_4_ = 0;
      decoder_get_uint32_value((ndn_decoder_t *)auStack_68,(uint32_t *)((long)&key + 4));
      if (key._4_4_ != type) {
        printf("ERROR: %s, L%d: ","ndn_parse_encrypted_payload",0x75);
        printf("[ENCODING] Received KeyID %u and Input KeyID %u not match\n",(ulong)key._4_4_,
               (ulong)type);
        return key._4_4_ - type;
      }
    }
    else if (encrypted_payload_length == 0x88) {
      decoder._8_8_ = _auStack_68 + decoder.input_value._4_4_;
      iv._4_4_ = local_40;
      decoder_move_forward((ndn_decoder_t *)auStack_68,local_40);
    }
    else {
      decoder_move_forward((ndn_decoder_t *)auStack_68,local_40);
    }
    local_79 = encrypted_payload == (uint8_t *)0x0 || decoder._8_8_ == 0;
  } while (local_79);
  aes_key = ndn_key_storage_get_aes_key(type);
  if (aes_key == (ndn_aes_key_t *)0x0) {
    input_local._4_4_ = -0x49;
  }
  else {
    input_local._4_4_ =
         ndn_aes_cbc_decrypt((uint8_t *)decoder._8_8_,iv._4_4_,(uint8_t *)output_size_local,_ret_val
                             ,encrypted_payload,aes_key);
    if (input_local._4_4_ == 0) {
      input_local._4_4_ = 0;
    }
  }
  return input_local._4_4_;
}

Assistant:

int
ndn_parse_encrypted_payload(const uint8_t* input, uint32_t input_size,
                            uint8_t* output, uint32_t* output_size, uint32_t aes_key_id)
{
  int ret_val = -1;
  uint32_t type = 0;
  uint32_t length = 0;
  uint32_t encrypted_payload_length = 0;
  const uint8_t* iv = NULL;
  const uint8_t* encrypted_payload = NULL;
  ndn_decoder_t decoder;
  decoder_init(&decoder, input, input_size);

  do {
    ret_val = decoder_get_type(&decoder, &type);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = decoder_get_length(&decoder, &length);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (type == TLV_AC_AES_IV) {
      if (length != NDN_AES_BLOCK_SIZE) return NDN_WRONG_TLV_LENGTH;
      iv = decoder.input_value + decoder.offset;
      decoder_move_forward(&decoder, length);
    }
    else if (type == TLV_AC_KEYID) {
      uint32_t keyid = 0;
      decoder_get_uint32_value(&decoder, &keyid);
      if (keyid != aes_key_id) {
        NDN_LOG_ERROR("[ENCODING] Received KeyID %u and Input KeyID %u not match\n", keyid, aes_key_id);
        return keyid - aes_key_id;
      }
    }
    else if (type == TLV_AC_ENCRYPTED_PAYLOAD) {
      encrypted_payload = decoder.input_value + decoder.offset;
      encrypted_payload_length = length;
      decoder_move_forward(&decoder, length);
    }
    else {
      decoder_move_forward(&decoder, length);
    }
  }
  while (iv == NULL || encrypted_payload == NULL);

  ndn_aes_key_t* key = ndn_key_storage_get_aes_key(aes_key_id);
  if (key == NULL) {
    return NDN_AC_KEY_NOT_FOUND;
  }
  ret_val = ndn_aes_cbc_decrypt(encrypted_payload, encrypted_payload_length,
                                output, output_size, iv, key);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}